

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O0

size_t wabt::ReadU32Leb128(uint8_t *p,uint8_t *end,uint32_t *out_value)

{
  uint32_t *out_value_local;
  uint8_t *end_local;
  uint8_t *p_local;
  
  if ((p < end) && ((*p & 0x80) == 0)) {
    *out_value = *p & 0x7f;
    p_local = (uint8_t *)0x1;
  }
  else if ((p + 1 < end) && ((p[1] & 0x80) == 0)) {
    *out_value = (p[1] & 0x7f) << 7 | *p & 0x7f;
    p_local = (uint8_t *)0x2;
  }
  else if ((p + 2 < end) && ((p[2] & 0x80) == 0)) {
    *out_value = (p[2] & 0x7f) << 0xe | (p[1] & 0x7f) << 7 | *p & 0x7f;
    p_local = (uint8_t *)0x3;
  }
  else if ((p + 3 < end) && ((p[3] & 0x80) == 0)) {
    *out_value = (p[3] & 0x7f) << 0x15 | (p[2] & 0x7f) << 0xe | (p[1] & 0x7f) << 7 | *p & 0x7f;
    p_local = (uint8_t *)0x4;
  }
  else if ((p + 4 < end) && ((p[4] & 0x80) == 0)) {
    if ((p[4] & 0xf0) == 0) {
      *out_value = (uint)p[4] << 0x1c |
                   (p[3] & 0x7f) << 0x15 | (p[2] & 0x7f) << 0xe | (p[1] & 0x7f) << 7 | *p & 0x7f;
      p_local = (uint8_t *)0x5;
    }
    else {
      p_local = (uint8_t *)0x0;
    }
  }
  else {
    *out_value = 0;
    p_local = (uint8_t *)0x0;
  }
  return (size_t)p_local;
}

Assistant:

size_t ReadU32Leb128(const uint8_t* p,
                     const uint8_t* end,
                     uint32_t* out_value) {
  if (p < end && (p[0] & 0x80) == 0) {
    *out_value = LEB128_1(uint32_t);
    return 1;
  } else if (p + 1 < end && (p[1] & 0x80) == 0) {
    *out_value = LEB128_2(uint32_t);
    return 2;
  } else if (p + 2 < end && (p[2] & 0x80) == 0) {
    *out_value = LEB128_3(uint32_t);
    return 3;
  } else if (p + 3 < end && (p[3] & 0x80) == 0) {
    *out_value = LEB128_4(uint32_t);
    return 4;
  } else if (p + 4 < end && (p[4] & 0x80) == 0) {
    // The top bits set represent values > 32 bits.
    if (p[4] & 0xf0) {
      return 0;
    }
    *out_value = LEB128_5(uint32_t);
    return 5;
  } else {
    // past the end.
    *out_value = 0;
    return 0;
  }
}